

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemInterface::handleKeyEvent<QWindowSystemInterface::SynchronousDelivery>
               (QWindow *window,ulong timestamp,Type t,int k,KeyboardModifiers mods,QString *text,
               bool autorep,ushort count)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  unsigned_long in_RDI;
  undefined8 in_R9;
  undefined1 args_6;
  long in_FS_OFFSET;
  unsigned_short in_stack_00000018;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QWindow *in_stack_ffffffffffffffd8;
  long lVar2;
  
  args_6 = (undefined1)((ulong)in_R9 >> 0x38);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar1 = handleWindowSystemEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindowSystemInterface::SynchronousDelivery,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,QString,bool,unsigned_short>
                    (in_stack_ffffffffffffffd8,in_RDI,(Type)((ulong)in_RSI >> 0x20),(int)in_RSI,
                     (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84((ulong)lVar2 >> 0x20,0),
                     (QString *)CONCAT44(in_EDX,in_ECX),(bool)args_6,in_stack_00000018);
  QString::~QString((QString *)0x445719);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

QT_DEFINE_QPA_EVENT_HANDLER(bool, handleKeyEvent, QWindow *window, ulong timestamp, QEvent::Type t, int k, Qt::KeyboardModifiers mods, const QString & text, bool autorep, ushort count)
{
    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::KeyEvent, Delivery>(window,
        timestamp, t, k, mods, text, autorep, count);
}